

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O3

int pem_write_RSAPublicKey_i2d(void *x,uchar **outp)

{
  int iVar1;
  CBB CStack_40;
  
  iVar1 = CBB_init(&CStack_40,0);
  if ((iVar1 != 0) && (iVar1 = RSA_marshal_public_key(&CStack_40,(RSA *)x), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&CStack_40,outp);
    return iVar1;
  }
  CBB_cleanup(&CStack_40);
  return -1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}